

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_modem.c
# Opt level: O0

int init_modem(mm_serial_context_t *pserial_context,char *modem_reset_string,char *modem_init_string
              )

{
  int iVar1;
  int status;
  char *modem_init_string_local;
  char *modem_reset_string_local;
  mm_serial_context_t *pserial_context_local;
  
  if ((modem_reset_string != (char *)0x0) && (*modem_reset_string != '\0')) {
    printf("Resetting modem: \'%s\'\n",modem_reset_string);
    iVar1 = send_at_command(pserial_context,modem_reset_string);
    if (iVar1 != 0) {
      return -1;
    }
  }
  printf("Intializing modem: \'%s\'\n",modem_init_string);
  iVar1 = send_at_command(pserial_context,modem_init_string);
  if (iVar1 == 0) {
    pserial_context_local._4_4_ = 0;
  }
  else {
    pserial_context_local._4_4_ = -1;
  }
  return pserial_context_local._4_4_;
}

Assistant:

int init_modem(mm_serial_context_t *pserial_context, const char *modem_reset_string, const char *modem_init_string) {
    int status;

    // Only do a separate reset if the modem_reset_string is present
    if (modem_reset_string != NULL && *modem_reset_string != '\0') {
        printf("Resetting modem: '%s'\n", modem_reset_string);
        status = send_at_command(pserial_context, modem_reset_string);
        if (status != MODEM_RSP_OK) {
            return -1;
        }
    }

    printf("Intializing modem: '%s'\n", modem_init_string);
    status = send_at_command(pserial_context, modem_init_string);

    if (status != MODEM_RSP_OK) {
        return -1;
    }
    return status;
}